

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_matcher.hpp
# Opt level: O0

bool __thiscall
iutest::detail::PropertyMatcher<int_(test::syntax_tests::X::*)()_const,_int>::
Check<test::syntax_tests::X>
          (PropertyMatcher<int_(test::syntax_tests::X::*)()_const,_int> *this,X *actual,
          type **param_2)

{
  bool bVar1;
  long *plVar2;
  code *local_90;
  int local_5c;
  EqMatcher<int> local_58;
  AssertionResult local_48;
  type **local_20;
  type **param_2_local;
  X *actual_local;
  PropertyMatcher<int_(test::syntax_tests::X::*)()_const,_int> *this_local;
  
  local_20 = param_2;
  param_2_local = (type **)actual;
  actual_local = (X *)this;
  CastToMatcher<int>((int *)&local_58,(type **)&this->m_expected);
  local_90 = (code *)*this->m_property;
  plVar2 = (long *)((long)param_2_local + this->m_property[1]);
  if (((ulong)local_90 & 1) != 0) {
    local_90 = *(code **)(local_90 + *plVar2 + -1);
  }
  local_5c = (*local_90)(plVar2);
  EqMatcher<int>::operator()(&local_48,&local_58,&local_5c);
  bVar1 = AssertionResult::operator_cast_to_bool(&local_48);
  AssertionResult::~AssertionResult(&local_48);
  EqMatcher<int>::~EqMatcher(&local_58);
  return bVar1;
}

Assistant:

bool Check(const U& actual
        , typename detail::disable_if_t< detail::is_pointer<U> >::type*& = detail::enabler::value)
    {
        return static_cast<bool>(CastToMatcher(m_expected)((actual.*m_property)()));
    }